

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

void helper_booke206_tlbre_ppc64(CPUPPCState_conflict2 *env)

{
  ppcmas_tlb_t *ppVar1;
  long lVar2;
  uintptr_t tlbml;
  uint uVar3;
  int i;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  target_ulong *ptVar7;
  int iVar8;
  
  ppVar1 = booke206_cur_tlb(env);
  uVar6 = 0;
  if (ppVar1 == (ppcmas_tlb_t *)0x0) {
    lVar2 = 0x1ea0;
LAB_00b5a8af:
    *(ulong *)((long)env->gpr + lVar2) = uVar6;
    return;
  }
  ptVar7 = env->spr + 0x2b0;
  lVar2 = 0;
  do {
    uVar4 = ((uint)*ptVar7 & 0xfff) + (int)uVar6;
    uVar6 = (ulong)uVar4;
    uVar3 = (uint)((ulong)((long)ppVar1 - (long)(env->tlb).tlb6) / 0x18);
    if ((int)uVar3 < (int)uVar4) {
      lVar5 = 0;
      iVar8 = 0;
      goto LAB_00b5a828;
    }
    lVar2 = lVar2 + 0x10000000;
    ptVar7 = ptVar7 + 1;
  } while (lVar2 != 0x40000000);
  goto LAB_00b5a847;
  while (lVar5 = lVar5 + 1, lVar5 != 4) {
LAB_00b5a828:
    iVar8 = ((uint)env->spr[lVar5 + 0x2b0] & 0xfff) + iVar8;
    if ((int)uVar3 < iVar8) {
      env->spr[0x270] =
           (long)(int)((uint)lVar2 | env->last_way |
                      (*(byte *)((long)env->spr + lVar5 * 8 + 0x1583) - 1 & uVar3) << 0x10);
      env->spr[0x271] = (ulong)ppVar1->mas1;
      env->spr[0x272] = ppVar1->mas2;
      uVar6 = ppVar1->mas7_3;
      env->spr[0x273] = uVar6;
      uVar6 = uVar6 >> 0x20;
      lVar2 = 0x2898;
      goto LAB_00b5a8af;
    }
  }
LAB_00b5a847:
  cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,"Unknown TLBe: %d\n");
}

Assistant:

void helper_booke206_tlbre(CPUPPCState *env)
{
    ppcmas_tlb_t *tlb = NULL;

    tlb = booke206_cur_tlb(env);
    if (!tlb) {
        env->spr[SPR_BOOKE_MAS1] = 0;
    } else {
        booke206_tlb_to_mas(env, tlb);
    }
}